

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double * __thiscall ON_3dPoint::operator[](ON_3dPoint *this,uint i)

{
  ON_3dPoint *local_38;
  ON_3dPoint *local_30;
  double *pd;
  uint i_local;
  ON_3dPoint *this_local;
  
  local_30 = this;
  if (i != 0) {
    if (i < 2) {
      local_38 = (ON_3dPoint *)&this->y;
    }
    else {
      local_38 = (ON_3dPoint *)&this->z;
    }
    local_30 = local_38;
  }
  return &local_30->x;
}

Assistant:

double& ON_3dPoint::operator[](unsigned int i)
{
  double* pd = (i<=0)? &x : ( (i>=2) ?  &z : &y);
  return *pd;
}